

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

bool __thiscall r_exec::StructureValue::contains(StructureValue *this,Atom *s)

{
  _Object *p_Var1;
  _func_int **pp_Var2;
  char cVar3;
  undefined1 uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  ulong uVar9;
  undefined4 extraout_var_01;
  byte bVar10;
  float fVar11;
  float fVar12;
  Atom _a;
  Atom a;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  p_Var1 = (this->structure).object;
  bVar10 = 0;
  iVar6 = (*p_Var1->_vptr__Object[4])(p_Var1,0);
  cVar3 = r_code::Atom::operator!=((Atom *)CONCAT44(extraout_var,iVar6),s);
  if (cVar3 == '\0') {
    p_Var1 = (this->structure).object;
    (*p_Var1->_vptr__Object[4])(p_Var1,0);
    cVar3 = r_code::Atom::getDescriptor();
    p_Var1 = (this->structure).object;
    pp_Var2 = p_Var1->_vptr__Object;
    if (cVar3 == -0x39) {
      iVar6 = (*pp_Var2[4])(p_Var1,0);
      uVar8 = r_code::Utils::GetTimestamp((Atom *)CONCAT44(extraout_var_00,iVar6));
      uVar9 = r_code::Utils::GetTimestamp(s);
      uVar4 = r_code::Utils::Synchronous(uVar8,uVar9);
      return (bool)uVar4;
    }
    local_3c = (*pp_Var2[6])();
    bVar10 = 1;
    if (1 < (ushort)local_3c) {
      uVar8 = 1;
      do {
        p_Var1 = (this->structure).object;
        iVar6 = (*p_Var1->_vptr__Object[4])(p_Var1,uVar8 & 0xffff);
        local_34 = *(undefined4 *)CONCAT44(extraout_var_01,iVar6);
        local_38 = *(undefined4 *)(s + uVar8 * 4);
        cVar3 = r_code::Atom::operator==((Atom *)&local_34,(Atom *)&local_38);
        if (cVar3 == '\0') {
          cVar5 = r_code::Atom::isFloat();
          if ((cVar5 == '\0') || (cVar5 = r_code::Atom::isFloat(), cVar5 == '\0')) {
            local_3c = 0;
          }
          else {
            fVar11 = (float)r_code::Atom::asFloat();
            fVar12 = (float)r_code::Atom::asFloat();
            local_3c = r_code::Utils::Equal((double)fVar11,(double)fVar12);
          }
        }
        r_code::Atom::~Atom((Atom *)&local_38);
        r_code::Atom::~Atom((Atom *)&local_34);
        if (cVar3 == '\0') {
          bVar10 = (byte)local_3c;
          break;
        }
        uVar8 = uVar8 + 1;
        uVar7 = (*((this->structure).object)->_vptr__Object[6])();
      } while (uVar8 < (uVar7 & 0xffff));
    }
  }
  return (bool)(bVar10 & 1);
}

Assistant:

bool StructureValue::contains(const Atom *s) const
{
    if (structure->code(0) != s[0]) {
        return false;
    }

    if (structure->code(0).getDescriptor() == Atom::TIMESTAMP) {
        return Utils::Synchronous(Utils::GetTimestamp(&structure->code(0)), Utils::GetTimestamp(s));
    }

    for (uint16_t i = 1; i < structure->code_size(); ++i) {
        Atom a = structure->code(i);
        Atom _a = s[i];

        if (a == _a) {
            continue;
        }

        if (a.isFloat() && _a.isFloat()) {
            return Utils::Equal(a.asFloat(), _a.asFloat());
        }

        return false;
    }

    return true;
}